

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char char_to_hex(char c)

{
  undefined1 local_9;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      if ((c < 'A') || ('F' < c)) {
        local_9 = -1;
      }
      else {
        local_9 = c + -0x37;
      }
    }
    else {
      local_9 = c + -0x57;
    }
  }
  else {
    local_9 = c + -0x30;
  }
  return local_9;
}

Assistant:

signed char char_to_hex(const char c)
{
	if (c >= '0' && c <= '9')
		return (signed char)(c - '0');

	if (c >= 'a' && c <= 'f')
		return (signed char)(c - 'a' + 10);

	if (c >= 'A' && c <= 'F')
		return (signed char)(c - 'A' + 10);

	return (signed char)-1;
}